

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.h
# Opt level: O1

void ptls_aead__do_encrypt
               (ptls_aead_context_t *ctx,void *output,void *input,size_t inlen,uint64_t seq,
               void *aad,size_t aadlen,ptls_aead_supplementary_encryption_t *supp)

{
  (*ctx->do_encrypt_init)(ctx,seq,aad,aadlen);
  (*ctx->do_encrypt_update)(ctx,output,input,inlen);
  (*ctx->do_encrypt_final)(ctx,(void *)((long)output + inlen));
  if (supp != (ptls_aead_supplementary_encryption_t *)0x0) {
    (*supp->ctx->do_init)(supp->ctx,supp->input);
    supp->output[0] = '\0';
    supp->output[1] = '\0';
    supp->output[2] = '\0';
    supp->output[3] = '\0';
    supp->output[4] = '\0';
    supp->output[5] = '\0';
    supp->output[6] = '\0';
    supp->output[7] = '\0';
    supp->output[8] = '\0';
    supp->output[9] = '\0';
    supp->output[10] = '\0';
    supp->output[0xb] = '\0';
    supp->output[0xc] = '\0';
    supp->output[0xd] = '\0';
    supp->output[0xe] = '\0';
    supp->output[0xf] = '\0';
    (*supp->ctx->do_transform)(supp->ctx,supp->output,supp->output,0x10);
    return;
  }
  return;
}

Assistant:

inline void ptls_aead__do_encrypt(ptls_aead_context_t *ctx, void *output, const void *input, size_t inlen, uint64_t seq,
                                  const void *aad, size_t aadlen, ptls_aead_supplementary_encryption_t *supp)
{
    ctx->do_encrypt_init(ctx, seq, aad, aadlen);
    ctx->do_encrypt_update(ctx, output, input, inlen);
    ctx->do_encrypt_final(ctx, (uint8_t *)output + inlen);

    if (supp != NULL) {
        ptls_cipher_init(supp->ctx, supp->input);
        memset(supp->output, 0, sizeof(supp->output));
        ptls_cipher_encrypt(supp->ctx, supp->output, supp->output, sizeof(supp->output));
    }
}